

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O0

void __thiscall RenX_ExtraLoggingPlugin::RenX_ExtraLoggingPlugin(RenX_ExtraLoggingPlugin *this)

{
  tm *ptVar1;
  time_t local_18;
  time_t current_time;
  RenX_ExtraLoggingPlugin *this_local;
  
  current_time = (time_t)this;
  RenX::Plugin::Plugin(&this->super_Plugin);
  *(undefined ***)this = &PTR_think_00115840;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_00115d20;
  std::__cxx11::string::string((string *)&this->filePrefix);
  std::__cxx11::string::string((string *)&this->consolePrefix);
  std::__cxx11::string::string((string *)&this->newDayFmt);
  local_18 = time((time_t *)0x0);
  ptVar1 = localtime(&local_18);
  this->day = ptVar1->tm_yday;
  return;
}

Assistant:

RenX_ExtraLoggingPlugin::RenX_ExtraLoggingPlugin()
{
    time_t current_time = time(nullptr);
    RenX_ExtraLoggingPlugin::day = localtime(&current_time)->tm_yday;
}